

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O2

void __thiscall VRle::Data::opGeneric(Data *this,Data *aObj,Data *bObj,Op op)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  long lVar4;
  EVP_PKEY_CTX *pEVar5;
  long lVar6;
  pointer dst;
  EVP_PKEY_CTX *src;
  pointer pSVar7;
  pointer pSVar8;
  pointer dst_00;
  VRect VVar9;
  VRect VVar10;
  Result result;
  rle_view local_848;
  rle_view local_838;
  EVP_PKEY_CTX local_828 [2040];
  
  dst = (aObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
        super__Vector_impl_data._M_start;
  pSVar2 = (aObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
           super__Vector_impl_data._M_finish;
  src = (EVP_PKEY_CTX *)((long)pSVar2 - (long)dst >> 3);
  dst_00 = (bObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (bObj->mSpans).super__Vector_base<VRle::Span,_std::allocator<VRle::Span>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar5 = (EVP_PKEY_CTX *)((long)pSVar3 - (long)dst_00 >> 3);
  std::vector<VRle::Span,_std::allocator<VRle::Span>_>::reserve
            (&this->mSpans,(size_type)(pEVar5 + (long)src));
  VVar9 = bbox(aObj);
  VVar10 = bbox(bObj);
  if (((VVar9.x1 < VVar10.x2 && VVar10.x1 < VVar9.x2) && (VVar10.y1 < VVar9.y2)) &&
     (VVar9.y1 < VVar10.y2)) {
    for (lVar4 = 0;
        (pSVar1 = (pointer)((long)&dst->x + lVar4), pSVar1 != pSVar2 &&
        (*(short *)((long)&dst->y + lVar4) < dst_00->y)); lVar4 = lVar4 + 8) {
    }
    if (lVar4 != 0) {
      copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)(lVar4 >> 3));
    }
    pSVar7 = dst_00;
    if (pSVar1 != pSVar2) {
      lVar6 = 0;
      for (pSVar8 = dst_00; (pSVar8 != pSVar3 && (pSVar8->y < *(short *)((long)&dst->y + lVar4)));
          pSVar8 = pSVar8 + 1) {
        lVar6 = lVar6 + -8;
      }
      pSVar7 = (pointer)((long)dst_00 - lVar6);
      if (lVar6 != 0) {
        copy((EVP_PKEY_CTX *)dst_00,(EVP_PKEY_CTX *)(-lVar6 >> 3));
        dst_00 = pSVar8;
      }
    }
    src = (EVP_PKEY_CTX *)(((long)pSVar2 - (long)dst) - lVar4 >> 3);
    local_848._size = (long)pSVar3 - (long)pSVar7 >> 3;
    local_848._data = dst_00;
    local_838._data = pSVar1;
    local_838._size = (size_t)src;
    std::array<VRle::Span,_255UL>::array((array<VRle::Span,_255UL> *)local_828);
    while (src != (EVP_PKEY_CTX *)0x0) {
      dst = local_838._data;
      if ((EVP_PKEY_CTX *)local_848._size == (EVP_PKEY_CTX *)0x0) goto LAB_0010fa35;
      pEVar5 = (EVP_PKEY_CTX *)_opGeneric(&local_838,&local_848,(Result *)local_828,op);
      src = (EVP_PKEY_CTX *)local_838._size;
      if (pEVar5 != (EVP_PKEY_CTX *)0x0) {
        copy(local_828,pEVar5);
        src = (EVP_PKEY_CTX *)local_838._size;
      }
    }
    src = (EVP_PKEY_CTX *)local_848._size;
    dst = local_848._data;
    if ((EVP_PKEY_CTX *)local_848._size == (EVP_PKEY_CTX *)0x0) goto LAB_0010fa3d;
  }
  else if (dst->y < dst_00->y) {
    copy((EVP_PKEY_CTX *)dst,src);
    src = pEVar5;
    dst = dst_00;
  }
  else {
    copy((EVP_PKEY_CTX *)dst_00,pEVar5);
  }
LAB_0010fa35:
  copy((EVP_PKEY_CTX *)dst,src);
LAB_0010fa3d:
  this->mBboxDirty = true;
  return;
}

Assistant:

void VRle::Data::opGeneric(const VRle::Data &aObj, const VRle::Data &bObj,
                           Op op)
{
    // This routine assumes, obj1(span_y) < obj2(span_y).

    auto a = aObj.view();
    auto b = bObj.view();

    // reserve some space for the result vector.
    mSpans.reserve(a.size() + b.size());

    // if two rle are disjoint
    if (!aObj.bbox().intersects(bObj.bbox())) {
        if (a.data()[0].y < b.data()[0].y) {
            copy(a.data(), a.size(), mSpans);
            copy(b.data(), b.size(), mSpans);
        } else {
            copy(b.data(), b.size(), mSpans);
            copy(a.data(), a.size(), mSpans);
        }
    } else {
        auto aPtr = a.data();
        auto aEnd = a.data() + a.size();
        auto bPtr = b.data();
        auto bEnd = b.data() + b.size();

        // 1. forward a till it intersects with b
        while ((aPtr != aEnd) && (aPtr->y < bPtr->y)) aPtr++;

        auto count = aPtr - a.data();
        if (count) copy(a.data(), count, mSpans);

        // 2. forward b till it intersects with a
        if (aPtr != aEnd)
            while ((bPtr != bEnd) && (bPtr->y < aPtr->y)) bPtr++;

        count = bPtr - b.data();
        if (count) copy(b.data(), count, mSpans);

        // update a and b object
        a = {aPtr, size_t(aEnd - aPtr)};
        b = {bPtr, size_t(bEnd - bPtr)};

        // 3. calculate the intersect region
        Result result;

        // run till all the spans are processed
        while (a.size() && b.size()) {
            auto count = _opGeneric(a, b, result, op);
            if (count) copy(result.data(), count, mSpans);
        }
        // 3. copy the rest
        if (b.size()) copy(b.data(), b.size(), mSpans);
        if (a.size()) copy(a.data(), a.size(), mSpans);
    }

    mBboxDirty = true;
}